

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

void cmsys::regtail(char *p,char *val)

{
  char *pcVar1;
  short local_2c;
  int offset;
  char *temp;
  char *scan;
  char *val_local;
  char *p_local;
  
  pcVar1 = p;
  if (p != &regdummy) {
    do {
      temp = pcVar1;
      pcVar1 = regnext(temp);
    } while (pcVar1 != (char *)0x0);
    if (*temp == '\a') {
      local_2c = (short)temp - (short)val;
    }
    else {
      local_2c = (short)val - (short)temp;
    }
    temp[1] = (char)((ushort)local_2c >> 8);
    temp[2] = (char)local_2c;
  }
  return;
}

Assistant:

static void regtail(char* p, const char* val)
{
  char* scan;
  char* temp;
  int offset;

  if (p == &regdummy)
    return;

  // Find last node.
  scan = p;
  for (;;) {
    temp = regnext(scan);
    if (temp == 0)
      break;
    scan = temp;
  }

  if (OP(scan) == BACK)
    offset = int(scan - val);
  else
    offset = int(val - scan);
  *(scan + 1) = static_cast<char>((offset >> 8) & 0377);
  *(scan + 2) = static_cast<char>(offset & 0377);
}